

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlock.c
# Opt level: O0

void closemutex(int sig)

{
  uint local_18;
  int local_14;
  int i;
  Uint32 id;
  int sig_local;
  
  local_18 = SDL_ThreadID();
  if (local_18 == mainthread) {
    local_18 = 0;
  }
  printf("Process %u:  Cleaning up...\n",(ulong)local_18);
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    SDL_KillThread(threads[local_14]);
  }
  SDL_DestroyMutex(mutex);
  exit(sig);
}

Assistant:

void closemutex(int sig)
{
	Uint32 id = SDL_ThreadID();
	int i;
	printf("Process %u:  Cleaning up...\n", id == mainthread ? 0 : id);
	for ( i=0; i<6; ++i )
		SDL_KillThread(threads[i]);
	SDL_DestroyMutex(mutex);
	exit(sig);
}